

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O2

p_rank * __thiscall
dna_string::block_rank
          (p_rank *__return_storage_ptr__,dna_string *this,uint64_t superblock_number,
          uint64_t block_number)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  ushort uVar16;
  byte bVar27;
  char cVar28;
  byte bVar29;
  char cVar30;
  byte bVar31;
  char cVar32;
  byte bVar33;
  char cVar34;
  byte bVar35;
  undefined1 auVar25 [16];
  char cVar36;
  ushort uVar37;
  byte bVar48;
  char cVar49;
  byte bVar50;
  char cVar51;
  byte bVar52;
  char cVar53;
  byte bVar54;
  char cVar55;
  byte bVar56;
  undefined1 auVar46 [16];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [12];
  undefined1 auVar72 [16];
  undefined1 auVar68 [12];
  undefined1 auVar74 [16];
  undefined4 uVar17;
  undefined6 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined4 uVar38;
  undefined6 uVar39;
  undefined8 uVar40;
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [14];
  undefined1 auVar44 [14];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar59 [14];
  undefined1 auVar60 [14];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar69 [14];
  undefined1 auVar70 [14];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  
  auVar63 = _DAT_0011b060;
  auVar14 = _DAT_0011b050;
  puVar1 = this->data;
  lVar5 = block_number * 0x40;
  uVar9 = *(ulong *)(puVar1 + lVar5 + 0x20 + superblock_number * 0x80000000);
  uVar6 = *(ulong *)(puVar1 + lVar5 + 0x28 + superblock_number * 0x80000000);
  uVar2 = *(ulong *)(puVar1 + lVar5 + 0x10 + superblock_number * 0x80000000);
  uVar8 = *(ulong *)(puVar1 + lVar5 + 0x18 + superblock_number * 0x80000000);
  uVar3 = *(ulong *)(puVar1 + lVar5 + superblock_number * 0x80000000);
  uVar4 = *(ulong *)(puVar1 + lVar5 + 8 + superblock_number * 0x80000000);
  uVar7 = ~(uVar4 | uVar8) & ~uVar6;
  uVar11 = ~(uVar8 | uVar6) & uVar4;
  uVar12 = ~(uVar3 | uVar2) & ~uVar9;
  uVar10 = ~(uVar2 | uVar9) & uVar3;
  auVar13._0_2_ = (ushort)uVar7 >> 1;
  auVar13._2_2_ = (ushort)(uVar7 >> 0x10) >> 1;
  auVar13._4_2_ = (ushort)(uVar7 >> 0x20) >> 1;
  auVar13._6_2_ = (ushort)(uVar7 >> 0x31);
  auVar13._8_2_ = (ushort)uVar11 >> 1;
  auVar13._10_2_ = (ushort)(uVar11 >> 0x10) >> 1;
  auVar13._12_2_ = (ushort)(uVar11 >> 0x20) >> 1;
  auVar13._14_2_ = (ushort)(uVar11 >> 0x31);
  auVar13 = auVar13 & _DAT_0011b050;
  uVar16 = CONCAT11((char)(uVar7 >> 8) - auVar13[1],(char)uVar7 - auVar13[0]);
  uVar17 = CONCAT13((char)(uVar7 >> 0x18) - auVar13[3],
                    CONCAT12((char)(uVar7 >> 0x10) - auVar13[2],uVar16));
  uVar18 = CONCAT15((char)(uVar7 >> 0x28) - auVar13[5],
                    CONCAT14((char)(uVar7 >> 0x20) - auVar13[4],uVar17));
  uVar19 = CONCAT17((char)(uVar7 >> 0x38) - auVar13[7],
                    CONCAT16((char)(uVar7 >> 0x30) - auVar13[6],uVar18));
  auVar20._0_10_ =
       CONCAT19((char)(uVar11 >> 8) - auVar13[9],CONCAT18((char)uVar11 - auVar13[8],uVar19));
  auVar20[10] = (char)(uVar11 >> 0x10) - auVar13[10];
  auVar20[0xb] = (char)(uVar11 >> 0x18) - auVar13[0xb];
  auVar22[0xc] = (char)(uVar11 >> 0x20) - auVar13[0xc];
  auVar22._0_12_ = auVar20;
  auVar22[0xd] = (char)(uVar11 >> 0x28) - auVar13[0xd];
  auVar24[0xe] = (char)(uVar11 >> 0x30) - auVar13[0xe];
  auVar24._0_14_ = auVar22;
  auVar24[0xf] = (char)(uVar11 >> 0x38) - auVar13[0xf];
  auVar13 = auVar24 & _DAT_0011b060;
  auVar25._0_2_ = uVar16 >> 2;
  auVar25._2_2_ = (ushort)((uint)uVar17 >> 0x12);
  auVar25._4_2_ = (ushort)((uint6)uVar18 >> 0x22);
  auVar25._6_2_ = (ushort)((ulong)uVar19 >> 0x32);
  auVar25._8_2_ = (ushort)((unkuint10)auVar20._0_10_ >> 0x42);
  auVar25._10_2_ = auVar20._10_2_ >> 2;
  auVar25._12_2_ = auVar22._12_2_ >> 2;
  auVar25._14_2_ = auVar24._14_2_ >> 2;
  auVar25 = auVar25 & _DAT_0011b060;
  cVar15 = auVar25[0] + auVar13[0];
  bVar27 = auVar25[1] + auVar13[1];
  uVar16 = CONCAT11(bVar27,cVar15);
  cVar28 = auVar25[2] + auVar13[2];
  bVar29 = auVar25[3] + auVar13[3];
  uVar17 = CONCAT13(bVar29,CONCAT12(cVar28,uVar16));
  cVar30 = auVar25[4] + auVar13[4];
  bVar31 = auVar25[5] + auVar13[5];
  uVar18 = CONCAT15(bVar31,CONCAT14(cVar30,uVar17));
  cVar32 = auVar25[6] + auVar13[6];
  bVar33 = auVar25[7] + auVar13[7];
  uVar19 = CONCAT17(bVar33,CONCAT16(cVar32,uVar18));
  cVar34 = auVar25[8] + auVar13[8];
  bVar35 = auVar25[9] + auVar13[9];
  auVar21._0_10_ = CONCAT19(bVar35,CONCAT18(cVar34,uVar19));
  auVar21[10] = auVar25[10] + auVar13[10];
  auVar21[0xb] = auVar25[0xb] + auVar13[0xb];
  auVar23[0xc] = auVar25[0xc] + auVar13[0xc];
  auVar23._0_12_ = auVar21;
  auVar23[0xd] = auVar25[0xd] + auVar13[0xd];
  auVar26[0xe] = auVar25[0xe] + auVar13[0xe];
  auVar26._0_14_ = auVar23;
  auVar26[0xf] = auVar25[0xf] + auVar13[0xf];
  auVar64._0_2_ = (ushort)uVar12 >> 1;
  auVar64._2_2_ = (ushort)(uVar12 >> 0x10) >> 1;
  auVar64._4_2_ = (ushort)(uVar12 >> 0x20) >> 1;
  auVar64._6_2_ = (ushort)(uVar12 >> 0x31);
  auVar64._8_2_ = (ushort)uVar10 >> 1;
  auVar64._10_2_ = (ushort)(uVar10 >> 0x10) >> 1;
  auVar64._12_2_ = (ushort)(uVar10 >> 0x20) >> 1;
  auVar64._14_2_ = (ushort)(uVar10 >> 0x31);
  auVar64 = auVar64 & _DAT_0011b050;
  uVar37 = CONCAT11((char)(uVar12 >> 8) - auVar64[1],(char)uVar12 - auVar64[0]);
  uVar38 = CONCAT13((char)(uVar12 >> 0x18) - auVar64[3],
                    CONCAT12((char)(uVar12 >> 0x10) - auVar64[2],uVar37));
  uVar39 = CONCAT15((char)(uVar12 >> 0x28) - auVar64[5],
                    CONCAT14((char)(uVar12 >> 0x20) - auVar64[4],uVar38));
  uVar40 = CONCAT17((char)(uVar12 >> 0x38) - auVar64[7],
                    CONCAT16((char)(uVar12 >> 0x30) - auVar64[6],uVar39));
  auVar41._0_10_ =
       CONCAT19((char)(uVar10 >> 8) - auVar64[9],CONCAT18((char)uVar10 - auVar64[8],uVar40));
  auVar41[10] = (char)(uVar10 >> 0x10) - auVar64[10];
  auVar41[0xb] = (char)(uVar10 >> 0x18) - auVar64[0xb];
  auVar43[0xc] = (char)(uVar10 >> 0x20) - auVar64[0xc];
  auVar43._0_12_ = auVar41;
  auVar43[0xd] = (char)(uVar10 >> 0x28) - auVar64[0xd];
  auVar45[0xe] = (char)(uVar10 >> 0x30) - auVar64[0xe];
  auVar45._0_14_ = auVar43;
  auVar45[0xf] = (char)(uVar10 >> 0x38) - auVar64[0xf];
  auVar13 = auVar45 & _DAT_0011b060;
  auVar46._0_2_ = uVar37 >> 2;
  auVar46._2_2_ = (ushort)((uint)uVar38 >> 0x12);
  auVar46._4_2_ = (ushort)((uint6)uVar39 >> 0x22);
  auVar46._6_2_ = (ushort)((ulong)uVar40 >> 0x32);
  auVar46._8_2_ = (ushort)((unkuint10)auVar41._0_10_ >> 0x42);
  auVar46._10_2_ = auVar41._10_2_ >> 2;
  auVar46._12_2_ = auVar43._12_2_ >> 2;
  auVar46._14_2_ = auVar45._14_2_ >> 2;
  auVar46 = auVar46 & _DAT_0011b060;
  cVar36 = auVar46[0] + auVar13[0];
  bVar48 = auVar46[1] + auVar13[1];
  uVar37 = CONCAT11(bVar48,cVar36);
  cVar49 = auVar46[2] + auVar13[2];
  bVar50 = auVar46[3] + auVar13[3];
  uVar38 = CONCAT13(bVar50,CONCAT12(cVar49,uVar37));
  cVar51 = auVar46[4] + auVar13[4];
  bVar52 = auVar46[5] + auVar13[5];
  uVar39 = CONCAT15(bVar52,CONCAT14(cVar51,uVar38));
  cVar53 = auVar46[6] + auVar13[6];
  bVar54 = auVar46[7] + auVar13[7];
  uVar40 = CONCAT17(bVar54,CONCAT16(cVar53,uVar39));
  cVar55 = auVar46[8] + auVar13[8];
  bVar56 = auVar46[9] + auVar13[9];
  auVar42._0_10_ = CONCAT19(bVar56,CONCAT18(cVar55,uVar40));
  auVar42[10] = auVar46[10] + auVar13[10];
  auVar42[0xb] = auVar46[0xb] + auVar13[0xb];
  auVar44[0xc] = auVar46[0xc] + auVar13[0xc];
  auVar44._0_12_ = auVar42;
  auVar44[0xd] = auVar46[0xd] + auVar13[0xd];
  auVar47[0xe] = auVar46[0xe] + auVar13[0xe];
  auVar47._0_14_ = auVar44;
  auVar47[0xf] = auVar46[0xf] + auVar13[0xf];
  auVar65[0] = ((char)(uVar37 >> 4) + cVar36 & 0xfU) + ((char)(uVar16 >> 4) + cVar15 & 0xfU);
  auVar65[1] = ((bVar48 >> 4) + bVar48 & 0xf) + ((bVar27 >> 4) + bVar27 & 0xf);
  auVar65[2] = ((char)(ushort)((uint)uVar38 >> 0x14) + cVar49 & 0xfU) +
               ((char)(ushort)((uint)uVar17 >> 0x14) + cVar28 & 0xfU);
  auVar65[3] = ((bVar50 >> 4) + bVar50 & 0xf) + ((bVar29 >> 4) + bVar29 & 0xf);
  auVar65[4] = ((char)(ushort)((uint6)uVar39 >> 0x24) + cVar51 & 0xfU) +
               ((char)(ushort)((uint6)uVar18 >> 0x24) + cVar30 & 0xfU);
  auVar65[5] = ((bVar52 >> 4) + bVar52 & 0xf) + ((bVar31 >> 4) + bVar31 & 0xf);
  auVar65[6] = ((char)(ushort)((ulong)uVar40 >> 0x34) + cVar53 & 0xfU) +
               ((char)(ushort)((ulong)uVar19 >> 0x34) + cVar32 & 0xfU);
  auVar65[7] = ((bVar54 >> 4) + bVar54 & 0xf) + ((bVar33 >> 4) + bVar33 & 0xf);
  auVar65[8] = ((char)(ushort)((unkuint10)auVar42._0_10_ >> 0x44) + cVar55 & 0xfU) +
               ((char)(ushort)((unkuint10)auVar21._0_10_ >> 0x44) + cVar34 & 0xfU);
  auVar65[9] = ((bVar56 >> 4) + bVar56 & 0xf) + ((bVar35 >> 4) + bVar35 & 0xf);
  auVar65[10] = ((char)(auVar42._10_2_ >> 4) + auVar42[10] & 0xfU) +
                ((char)(auVar21._10_2_ >> 4) + auVar21[10] & 0xfU);
  auVar65[0xb] = ((auVar42[0xb] >> 4) + auVar42[0xb] & 0xf) +
                 ((auVar21[0xb] >> 4) + auVar21[0xb] & 0xf);
  auVar65[0xc] = ((char)(auVar44._12_2_ >> 4) + auVar44[0xc] & 0xfU) +
                 ((char)(auVar23._12_2_ >> 4) + auVar23[0xc] & 0xfU);
  auVar65[0xd] = ((auVar44[0xd] >> 4) + auVar44[0xd] & 0xf) +
                 ((auVar23[0xd] >> 4) + auVar23[0xd] & 0xf);
  auVar65[0xe] = ((char)(auVar47._14_2_ >> 4) + auVar47[0xe] & 0xfU) +
                 ((char)(auVar26._14_2_ >> 4) + auVar26[0xe] & 0xfU);
  auVar65[0xf] = ((auVar47[0xf] >> 4) + auVar47[0xf] & 0xf) +
                 ((auVar26[0xf] >> 4) + auVar26[0xf] & 0xf);
  auVar13 = psadbw(auVar65,(undefined1  [16])0x0);
  __return_storage_ptr__->A = auVar13._0_8_;
  __return_storage_ptr__->C = auVar13._8_8_;
  uVar7 = ~(uVar6 | uVar4) & uVar8;
  uVar6 = uVar4 & uVar8 & ~uVar6;
  uVar8 = ~(uVar9 | uVar3) & uVar2;
  uVar9 = uVar3 & uVar2 & ~uVar9;
  auVar66._0_2_ = (ushort)uVar7 >> 1;
  auVar66._2_2_ = (ushort)(uVar7 >> 0x10) >> 1;
  auVar66._4_2_ = (ushort)(uVar7 >> 0x20) >> 1;
  auVar66._6_2_ = (ushort)(uVar7 >> 0x31);
  auVar66._8_2_ = (ushort)uVar6 >> 1;
  auVar66._10_2_ = (ushort)(uVar6 >> 0x10) >> 1;
  auVar66._12_2_ = (ushort)(uVar6 >> 0x20) >> 1;
  auVar66._14_2_ = (ushort)(uVar6 >> 0x31);
  auVar66 = auVar66 & auVar14;
  uVar16 = CONCAT11((char)(uVar7 >> 8) - auVar66[1],(char)uVar7 - auVar66[0]);
  uVar17 = CONCAT13((char)(uVar7 >> 0x18) - auVar66[3],
                    CONCAT12((char)(uVar7 >> 0x10) - auVar66[2],uVar16));
  uVar18 = CONCAT15((char)(uVar7 >> 0x28) - auVar66[5],
                    CONCAT14((char)(uVar7 >> 0x20) - auVar66[4],uVar17));
  uVar19 = CONCAT17((char)(uVar7 >> 0x38) - auVar66[7],
                    CONCAT16((char)(uVar7 >> 0x30) - auVar66[6],uVar18));
  auVar67._0_10_ =
       CONCAT19((char)(uVar6 >> 8) - auVar66[9],CONCAT18((char)uVar6 - auVar66[8],uVar19));
  auVar67[10] = (char)(uVar6 >> 0x10) - auVar66[10];
  auVar67[0xb] = (char)(uVar6 >> 0x18) - auVar66[0xb];
  auVar69[0xc] = (char)(uVar6 >> 0x20) - auVar66[0xc];
  auVar69._0_12_ = auVar67;
  auVar69[0xd] = (char)(uVar6 >> 0x28) - auVar66[0xd];
  auVar71[0xe] = (char)(uVar6 >> 0x30) - auVar66[0xe];
  auVar71._0_14_ = auVar69;
  auVar71[0xf] = (char)(uVar6 >> 0x38) - auVar66[0xf];
  auVar13 = auVar71 & auVar63;
  auVar72._0_2_ = uVar16 >> 2;
  auVar72._2_2_ = (ushort)((uint)uVar17 >> 0x12);
  auVar72._4_2_ = (ushort)((uint6)uVar18 >> 0x22);
  auVar72._6_2_ = (ushort)((ulong)uVar19 >> 0x32);
  auVar72._8_2_ = (ushort)((unkuint10)auVar67._0_10_ >> 0x42);
  auVar72._10_2_ = auVar67._10_2_ >> 2;
  auVar72._12_2_ = auVar69._12_2_ >> 2;
  auVar72._14_2_ = auVar71._14_2_ >> 2;
  auVar72 = auVar72 & auVar63;
  cVar36 = auVar72[0] + auVar13[0];
  bVar48 = auVar72[1] + auVar13[1];
  uVar37 = CONCAT11(bVar48,cVar36);
  cVar49 = auVar72[2] + auVar13[2];
  bVar50 = auVar72[3] + auVar13[3];
  uVar38 = CONCAT13(bVar50,CONCAT12(cVar49,uVar37));
  cVar51 = auVar72[4] + auVar13[4];
  bVar52 = auVar72[5] + auVar13[5];
  uVar39 = CONCAT15(bVar52,CONCAT14(cVar51,uVar38));
  cVar53 = auVar72[6] + auVar13[6];
  bVar54 = auVar72[7] + auVar13[7];
  uVar40 = CONCAT17(bVar54,CONCAT16(cVar53,uVar39));
  cVar55 = auVar72[8] + auVar13[8];
  bVar56 = auVar72[9] + auVar13[9];
  auVar68._0_10_ = CONCAT19(bVar56,CONCAT18(cVar55,uVar40));
  auVar68[10] = auVar72[10] + auVar13[10];
  auVar68[0xb] = auVar72[0xb] + auVar13[0xb];
  auVar70[0xc] = auVar72[0xc] + auVar13[0xc];
  auVar70._0_12_ = auVar68;
  auVar70[0xd] = auVar72[0xd] + auVar13[0xd];
  auVar73[0xe] = auVar72[0xe] + auVar13[0xe];
  auVar73._0_14_ = auVar70;
  auVar73[0xf] = auVar72[0xf] + auVar13[0xf];
  auVar74._0_2_ = (ushort)uVar8 >> 1;
  auVar74._2_2_ = (ushort)(uVar8 >> 0x10) >> 1;
  auVar74._4_2_ = (ushort)(uVar8 >> 0x20) >> 1;
  auVar74._6_2_ = (ushort)(uVar8 >> 0x31);
  auVar74._8_2_ = (ushort)uVar9 >> 1;
  auVar74._10_2_ = (ushort)(uVar9 >> 0x10) >> 1;
  auVar74._12_2_ = (ushort)(uVar9 >> 0x20) >> 1;
  auVar74._14_2_ = (ushort)(uVar9 >> 0x31);
  auVar74 = auVar74 & auVar14;
  uVar16 = CONCAT11((char)(uVar8 >> 8) - auVar74[1],(char)uVar8 - auVar74[0]);
  uVar17 = CONCAT13((char)(uVar8 >> 0x18) - auVar74[3],
                    CONCAT12((char)(uVar8 >> 0x10) - auVar74[2],uVar16));
  uVar18 = CONCAT15((char)(uVar8 >> 0x28) - auVar74[5],
                    CONCAT14((char)(uVar8 >> 0x20) - auVar74[4],uVar17));
  uVar19 = CONCAT17((char)(uVar8 >> 0x38) - auVar74[7],
                    CONCAT16((char)(uVar8 >> 0x30) - auVar74[6],uVar18));
  auVar57._0_10_ =
       CONCAT19((char)(uVar9 >> 8) - auVar74[9],CONCAT18((char)uVar9 - auVar74[8],uVar19));
  auVar57[10] = (char)(uVar9 >> 0x10) - auVar74[10];
  auVar57[0xb] = (char)(uVar9 >> 0x18) - auVar74[0xb];
  auVar59[0xc] = (char)(uVar9 >> 0x20) - auVar74[0xc];
  auVar59._0_12_ = auVar57;
  auVar59[0xd] = (char)(uVar9 >> 0x28) - auVar74[0xd];
  auVar61[0xe] = (char)(uVar9 >> 0x30) - auVar74[0xe];
  auVar61._0_14_ = auVar59;
  auVar61[0xf] = (char)(uVar9 >> 0x38) - auVar74[0xf];
  auVar14 = auVar61 & auVar63;
  auVar62._0_2_ = uVar16 >> 2;
  auVar62._2_2_ = (ushort)((uint)uVar17 >> 0x12);
  auVar62._4_2_ = (ushort)((uint6)uVar18 >> 0x22);
  auVar62._6_2_ = (ushort)((ulong)uVar19 >> 0x32);
  auVar62._8_2_ = (ushort)((unkuint10)auVar57._0_10_ >> 0x42);
  auVar62._10_2_ = auVar57._10_2_ >> 2;
  auVar62._12_2_ = auVar59._12_2_ >> 2;
  auVar62._14_2_ = auVar61._14_2_ >> 2;
  auVar62 = auVar62 & auVar63;
  cVar15 = auVar62[0] + auVar14[0];
  bVar27 = auVar62[1] + auVar14[1];
  uVar16 = CONCAT11(bVar27,cVar15);
  cVar28 = auVar62[2] + auVar14[2];
  bVar29 = auVar62[3] + auVar14[3];
  uVar17 = CONCAT13(bVar29,CONCAT12(cVar28,uVar16));
  cVar30 = auVar62[4] + auVar14[4];
  bVar31 = auVar62[5] + auVar14[5];
  uVar18 = CONCAT15(bVar31,CONCAT14(cVar30,uVar17));
  cVar32 = auVar62[6] + auVar14[6];
  bVar33 = auVar62[7] + auVar14[7];
  uVar19 = CONCAT17(bVar33,CONCAT16(cVar32,uVar18));
  cVar34 = auVar62[8] + auVar14[8];
  bVar35 = auVar62[9] + auVar14[9];
  auVar58._0_10_ = CONCAT19(bVar35,CONCAT18(cVar34,uVar19));
  auVar58[10] = auVar62[10] + auVar14[10];
  auVar58[0xb] = auVar62[0xb] + auVar14[0xb];
  auVar60[0xc] = auVar62[0xc] + auVar14[0xc];
  auVar60._0_12_ = auVar58;
  auVar60[0xd] = auVar62[0xd] + auVar14[0xd];
  auVar63[0xe] = auVar62[0xe] + auVar14[0xe];
  auVar63._0_14_ = auVar60;
  auVar63[0xf] = auVar62[0xf] + auVar14[0xf];
  auVar14[0] = ((char)(uVar16 >> 4) + cVar15 & 0xfU) + ((char)(uVar37 >> 4) + cVar36 & 0xfU);
  auVar14[1] = ((bVar27 >> 4) + bVar27 & 0xf) + ((bVar48 >> 4) + bVar48 & 0xf);
  auVar14[2] = ((char)(ushort)((uint)uVar17 >> 0x14) + cVar28 & 0xfU) +
               ((char)(ushort)((uint)uVar38 >> 0x14) + cVar49 & 0xfU);
  auVar14[3] = ((bVar29 >> 4) + bVar29 & 0xf) + ((bVar50 >> 4) + bVar50 & 0xf);
  auVar14[4] = ((char)(ushort)((uint6)uVar18 >> 0x24) + cVar30 & 0xfU) +
               ((char)(ushort)((uint6)uVar39 >> 0x24) + cVar51 & 0xfU);
  auVar14[5] = ((bVar31 >> 4) + bVar31 & 0xf) + ((bVar52 >> 4) + bVar52 & 0xf);
  auVar14[6] = ((char)(ushort)((ulong)uVar19 >> 0x34) + cVar32 & 0xfU) +
               ((char)(ushort)((ulong)uVar40 >> 0x34) + cVar53 & 0xfU);
  auVar14[7] = ((bVar33 >> 4) + bVar33 & 0xf) + ((bVar54 >> 4) + bVar54 & 0xf);
  auVar14[8] = ((char)(ushort)((unkuint10)auVar58._0_10_ >> 0x44) + cVar34 & 0xfU) +
               ((char)(ushort)((unkuint10)auVar68._0_10_ >> 0x44) + cVar55 & 0xfU);
  auVar14[9] = ((bVar35 >> 4) + bVar35 & 0xf) + ((bVar56 >> 4) + bVar56 & 0xf);
  auVar14[10] = ((char)(auVar58._10_2_ >> 4) + auVar58[10] & 0xfU) +
                ((char)(auVar68._10_2_ >> 4) + auVar68[10] & 0xfU);
  auVar14[0xb] = ((auVar58[0xb] >> 4) + auVar58[0xb] & 0xf) +
                 ((auVar68[0xb] >> 4) + auVar68[0xb] & 0xf);
  auVar14[0xc] = ((char)(auVar60._12_2_ >> 4) + auVar60[0xc] & 0xfU) +
                 ((char)(auVar70._12_2_ >> 4) + auVar70[0xc] & 0xfU);
  auVar14[0xd] = ((auVar60[0xd] >> 4) + auVar60[0xd] & 0xf) +
                 ((auVar70[0xd] >> 4) + auVar70[0xd] & 0xf);
  auVar14[0xe] = ((char)(auVar63._14_2_ >> 4) + auVar63[0xe] & 0xfU) +
                 ((char)(auVar73._14_2_ >> 4) + auVar73[0xe] & 0xfU);
  auVar14[0xf] = ((auVar63[0xf] >> 4) + auVar63[0xf] & 0xf) +
                 ((auVar73[0xf] >> 4) + auVar73[0xf] & 0xf);
  auVar14 = psadbw(auVar14,(undefined1  [16])0x0);
  __return_storage_ptr__->G = auVar14._0_8_;
  __return_storage_ptr__->T = auVar14._8_8_;
  return __return_storage_ptr__;
}

Assistant:

inline p_rank block_rank(uint64_t superblock_number, uint64_t block_number){

		//starting address of the block
		uint8_t* start = data + superblock_number*BYTES_PER_SUPERBLOCK + block_number*BYTES_PER_BLOCK;

		//chars[0..3] contains 1st, 2nd, 3rd bits of the BLOCK_SIZE characters
		__uint128_t* chars = (__uint128_t*)(start);

		__uint128_t b2 = ~chars[2]; //most significant bit

		p_rank res = {

			popcount128(b2 & (~chars[1]) & (~chars[0])),
			popcount128(b2 & (~chars[1]) & (chars[0])),
			popcount128(b2 & (chars[1]) & (~chars[0])),
			popcount128(b2 & (chars[1]) & (chars[0]))

		};

		//assert(check_rank_local(res, superblock_number*SUPERBLOCK_SIZE + block_number*BLOCK_SIZE, block_off));

		return res;

	}